

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O2

string * __thiscall
de::FilePath::getFileExtension_abi_cxx11_(string *__return_storage_ptr__,FilePath *this)

{
  long lVar1;
  allocator<char> local_31;
  string baseName;
  
  getBaseName_abi_cxx11_(&baseName,this);
  lVar1 = std::__cxx11::string::rfind((char)&baseName,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_31);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&baseName);
  }
  std::__cxx11::string::~string((string *)&baseName);
  return __return_storage_ptr__;
}

Assistant:

std::string FilePath::getFileExtension (void) const
{
	std::string baseName = getBaseName();
	size_t dotPos = baseName.find_last_of('.');
	if (dotPos == std::string::npos)
		return std::string("");
	else
		return baseName.substr(dotPos+1);
}